

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns.c
# Opt level: O0

void FFT(NoiseSuppressionC *self,float *time_data,size_t time_data_length,size_t magnitude_length,
        float *real,float *imag,float *magn,float *lmagn,int prev_calc,float *signalEnergy,
        float *sumMagn)

{
  float fVar1;
  float fVar2;
  float energy;
  float last;
  float first;
  float *time_data_ptr;
  size_t i;
  float *imag_local;
  float *real_local;
  size_t magnitude_length_local;
  size_t time_data_length_local;
  float *time_data_local;
  NoiseSuppressionC *self_local;
  
  if (magnitude_length != (time_data_length >> 1) + 1) {
    __assert_fail("magnitude_length == time_data_length / 2 + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/src/ns.c"
                  ,0x611,
                  "void FFT(NoiseSuppressionC *, float *, size_t, size_t, float *, float *, float *, float *, int, float *, float *)"
                 );
  }
  WebRtc_rdft(time_data_length,1,time_data,self->ip,self->wfft);
  *imag = 0.0;
  *real = *time_data;
  *magn = ABS(*real) + 1.0;
  imag[magnitude_length - 1] = 0.0;
  real[magnitude_length - 1] = time_data[1];
  magn[magnitude_length - 1] = ABS(real[magnitude_length - 1]) + 1.0;
  _last = time_data + 2;
  if (prev_calc == 1) {
    fVar1 = *real * *real + *imag * *imag;
    fVar2 = real[magnitude_length - 1] * real[magnitude_length - 1] +
            imag[magnitude_length - 1] * imag[magnitude_length - 1];
    *signalEnergy = fVar1 + fVar2;
    fVar1 = sqrtf(fVar1);
    fVar2 = sqrtf(fVar2);
    *sumMagn = fVar1 + 2.0 + fVar2;
    fVar1 = logf(*magn);
    *lmagn = fVar1;
    fVar1 = logf(magn[magnitude_length - 1]);
    lmagn[magnitude_length - 1] = fVar1;
    for (time_data_ptr = (float *)0x1; time_data_ptr < (float *)(magnitude_length - 1);
        time_data_ptr = (float *)((long)time_data_ptr + 1)) {
      real[(long)time_data_ptr] = *_last;
      imag[(long)time_data_ptr] = _last[1];
      fVar1 = real[(long)time_data_ptr] * real[(long)time_data_ptr] +
              imag[(long)time_data_ptr] * imag[(long)time_data_ptr];
      *signalEnergy = fVar1 + *signalEnergy;
      fVar1 = sqrtf(fVar1);
      magn[(long)time_data_ptr] = fVar1 + 1.0;
      *sumMagn = magn[(long)time_data_ptr] + *sumMagn;
      fVar1 = logf(magn[(long)time_data_ptr]);
      lmagn[(long)time_data_ptr] = fVar1;
      _last = _last + 2;
    }
  }
  else {
    for (time_data_ptr = (float *)0x1; time_data_ptr < (float *)(magnitude_length - 1);
        time_data_ptr = (float *)((long)time_data_ptr + 1)) {
      real[(long)time_data_ptr] = *_last;
      imag[(long)time_data_ptr] = _last[1];
      fVar1 = sqrtf(real[(long)time_data_ptr] * real[(long)time_data_ptr] +
                    imag[(long)time_data_ptr] * imag[(long)time_data_ptr]);
      magn[(long)time_data_ptr] = fVar1 + 1.0;
      _last = _last + 2;
    }
  }
  return;
}

Assistant:

static void FFT(NoiseSuppressionC *self, float *time_data, size_t time_data_length, size_t magnitude_length,
                float *real, float *imag, float *magn, float *lmagn, int prev_calc, float *signalEnergy,
                float *sumMagn) {
    size_t i;

    assert(magnitude_length == time_data_length / 2 + 1);

    WebRtc_rdft(time_data_length, 1, time_data, self->ip, self->wfft);

    imag[0] = 0;
    real[0] = time_data[0];
    magn[0] = fabsf(real[0]) + 1.f;
    imag[magnitude_length - 1] = 0;
    real[magnitude_length - 1] = time_data[1];
    magn[magnitude_length - 1] = fabsf(real[magnitude_length - 1]) + 1.f;
    float *time_data_ptr = time_data + 2;
    if (prev_calc == 1) {
        float first = real[0] * real[0] + imag[0] * imag[0];
        float last = real[magnitude_length - 1] * real[magnitude_length - 1] +
                     imag[magnitude_length - 1] * imag[magnitude_length - 1];
        *signalEnergy = first + last;
        *sumMagn = sqrtf(first) + 2.f + sqrtf(last);
        lmagn[0] = logf(magn[0]);
        lmagn[magnitude_length - 1] = logf(magn[magnitude_length - 1]);
        for (i = 1; i < magnitude_length - 1; ++i) {
            real[i] = time_data_ptr[0];
            imag[i] = time_data_ptr[1];
            const float energy = real[i] * real[i] + imag[i] * imag[i];
            *signalEnergy += energy;
            // Magnitude spectrum.
            magn[i] = sqrtf(energy) + 1.f;
            *sumMagn += magn[i];
            lmagn[i] = logf(magn[i]);
            time_data_ptr += 2;
        }
    } else {
        for (i = 1; i < magnitude_length - 1; ++i) {
            real[i] = time_data_ptr[0];
            imag[i] = time_data_ptr[1];
            // Magnitude spectrum.
            magn[i] = sqrtf(real[i] * real[i] + imag[i] * imag[i]) + 1.f;
            time_data_ptr += 2;
        }
    }
}